

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O2

void google::protobuf::TestUtil::AddRepeatedFields2<proto2_unittest::TestAllTypes>
               (TestAllTypes *message)

{
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>_>
  *pVVar1;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>_>
  *pVVar2;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>_> *pVVar3;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>_>
  *pVVar4;
  Reflection *pRVar5;
  Descriptor *pDVar6;
  FieldDescriptor *pFVar7;
  string_view name;
  string_view name_00;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  RepeatedField<int>::Add(&(message->field_0)._impl_.repeated_int32_,0x12d);
  RepeatedField<long>::Add(&(message->field_0)._impl_.repeated_int64_,0x12e);
  RepeatedField<unsigned_int>::Add(&(message->field_0)._impl_.repeated_uint32_,0x12f);
  RepeatedField<unsigned_long>::Add(&(message->field_0)._impl_.repeated_uint64_,0x130);
  RepeatedField<int>::Add(&(message->field_0)._impl_.repeated_sint32_,0x131);
  RepeatedField<long>::Add(&(message->field_0)._impl_.repeated_sint64_,0x132);
  RepeatedField<unsigned_int>::Add(&(message->field_0)._impl_.repeated_fixed32_,0x133);
  RepeatedField<unsigned_long>::Add(&(message->field_0)._impl_.repeated_fixed64_,0x134);
  RepeatedField<int>::Add(&(message->field_0)._impl_.repeated_sfixed32_,0x135);
  RepeatedField<long>::Add(&(message->field_0)._impl_.repeated_sfixed64_,0x136);
  RepeatedField<float>::Add(&(message->field_0)._impl_.repeated_float_,311.0);
  RepeatedField<double>::Add(&(message->field_0)._impl_.repeated_double_,312.0);
  RepeatedField<bool>::Add(&(message->field_0)._impl_.repeated_bool_,false);
  internal::AddToRepeatedPtrField<char_const(&)[4]>
            (&(message->field_0)._impl_.repeated_string_,(char (*) [4])"315");
  internal::AddToRepeatedPtrField<char_const(&)[4],google::protobuf::internal::BytesTag>
            ((undefined1 *)((long)&message->field_0 + 0xf8),"316");
  pVVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>>
                     (&(message->field_0)._impl_.repeatedgroup_.super_RepeatedPtrFieldBase);
  (pVVar1->field_0)._impl_.a_ = 0x13d;
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                     (&(message->field_0)._impl_.repeated_nested_message_.super_RepeatedPtrFieldBase
                     );
  (pVVar2->field_0)._impl_.bb_ = 0x13e;
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pVVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>>
                     (&(message->field_0)._impl_.repeated_foreign_message_.
                       super_RepeatedPtrFieldBase);
  (pVVar3->field_0)._impl_.c_ = 0x13f;
  *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 1;
  pVVar4 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>>
                     (&(message->field_0)._impl_.repeated_import_message_.super_RepeatedPtrFieldBase
                     );
  (pVVar4->field_0)._impl_.d_ = 0x140;
  *(byte *)&pVVar4->field_0 = *(byte *)&pVVar4->field_0 | 1;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                     (&(message->field_0)._impl_.repeated_lazy_message_.super_RepeatedPtrFieldBase);
  (pVVar2->field_0)._impl_.bb_ = 0x147;
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  proto2_unittest::TestAllTypes::add_repeated_nested_enum(message,TestAllTypes_NestedEnum_BAZ);
  proto2_unittest::TestAllTypes::add_repeated_foreign_enum(message,FOREIGN_BAZ);
  proto2_unittest::TestAllTypes::add_repeated_import_enum(message,IMPORT_BAZ);
  pRVar5 = proto2_unittest::TestAllTypes::GetReflection();
  pDVar6 = proto2_unittest::TestAllTypes::GetDescriptor();
  name._M_str = "repeated_string_piece";
  name._M_len = 0x15;
  pFVar7 = Descriptor::FindFieldByName(pDVar6,name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"324",&local_59);
  Reflection::AddString(pRVar5,&message->super_Message,pFVar7,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pRVar5 = proto2_unittest::TestAllTypes::GetReflection();
  pDVar6 = proto2_unittest::TestAllTypes::GetDescriptor();
  name_00._M_str = "repeated_cord";
  name_00._M_len = 0xd;
  pFVar7 = Descriptor::FindFieldByName(pDVar6,name_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"325",&local_59);
  Reflection::AddString(pRVar5,&message->super_Message,pFVar7,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void AddRepeatedFields2(TestAllTypes* message) {
  // Add a second one of each field.
  message->add_repeated_int32(301);
  message->add_repeated_int64(302);
  message->add_repeated_uint32(303);
  message->add_repeated_uint64(304);
  message->add_repeated_sint32(305);
  message->add_repeated_sint64(306);
  message->add_repeated_fixed32(307);
  message->add_repeated_fixed64(308);
  message->add_repeated_sfixed32(309);
  message->add_repeated_sfixed64(310);
  message->add_repeated_float(311);
  message->add_repeated_double(312);
  message->add_repeated_bool(false);
  message->add_repeated_string("315");
  message->add_repeated_bytes("316");

  message->add_repeatedgroup()->set_a(317);
  message->add_repeated_nested_message()->set_bb(318);
  message->add_repeated_foreign_message()->set_c(319);
  message->add_repeated_import_message()->set_d(320);
  message->add_repeated_lazy_message()->set_bb(327);

  message->add_repeated_nested_enum(TestAllTypes::BAZ);
  message->add_repeated_foreign_enum(ForeignEnum<TestAllTypes>::FOREIGN_BAZ);
  message->add_repeated_import_enum(ImportEnum<TestAllTypes>::IMPORT_BAZ);

#ifndef PROTOBUF_TEST_NO_DESCRIPTORS
  message->GetReflection()->AddString(
      message,
      message->GetDescriptor()->FindFieldByName("repeated_string_piece"),
      "324");
  message->GetReflection()->AddString(
      message, message->GetDescriptor()->FindFieldByName("repeated_cord"),
      "325");
#endif  // !PROTOBUF_TEST_NO_DESCRIPTORS
}